

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

void __thiscall
llvm::yaml::IO::processKey<llvm::dwarf::Constants,llvm::yaml::EmptyContext>
          (IO *this,char *Key,Constants *Val,bool Required,EmptyContext *Ctx)

{
  uint uVar1;
  undefined1 local_39;
  undefined8 uStack_38;
  bool UseDefault;
  void *SaveInfo;
  EmptyContext *Ctx_local;
  Constants *pCStack_20;
  bool Required_local;
  Constants *Val_local;
  char *Key_local;
  IO *this_local;
  
  SaveInfo = Ctx;
  Ctx_local._7_1_ = Required;
  pCStack_20 = Val;
  Val_local = (Constants *)Key;
  Key_local = (char *)this;
  uVar1 = (*this->_vptr_IO[0xf])(this,Key,(ulong)Required,0,&local_39,&stack0xffffffffffffffc8);
  if ((uVar1 & 1) != 0) {
    yamlize<llvm::dwarf::Constants>
              (this,pCStack_20,(bool)(Ctx_local._7_1_ & 1),(EmptyContext *)SaveInfo);
    (*this->_vptr_IO[0x10])(this,uStack_38);
  }
  return;
}

Assistant:

void processKey(const char *Key, T &Val, bool Required, Context &Ctx) {
    void *SaveInfo;
    bool UseDefault;
    if ( this->preflightKey(Key, Required, false, UseDefault, SaveInfo) ) {
      yamlize(*this, Val, Required, Ctx);
      this->postflightKey(SaveInfo);
    }
  }